

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

iterator * __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
::operator()(iterator *__return_storage_ptr__,
            arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
            *this,void *value)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  value_type vVar4;
  undefined7 uVar5;
  error_handler local_19;
  
  if (((this->specs_ != (format_specs *)0x0) &&
      (cVar1 = (this->specs_->super_core_format_specs).type, cVar1 != '\0')) && (cVar1 != 'p')) {
    error_handler::on_error(&local_19,"invalid type specifier");
  }
  write_pointer(this,value);
  pcVar2 = (this->writer_).out_.super_truncating_iterator_base<char_*>.out_;
  sVar3 = (this->writer_).out_.super_truncating_iterator_base<char_*>.limit_;
  vVar4 = (this->writer_).out_.blackhole_;
  uVar5 = *(undefined7 *)&(this->writer_).out_.field_0x19;
  (__return_storage_ptr__->super_truncating_iterator_base<char_*>).count_ =
       (this->writer_).out_.super_truncating_iterator_base<char_*>.count_;
  __return_storage_ptr__->blackhole_ = vVar4;
  *(undefined7 *)&__return_storage_ptr__->field_0x19 = uVar5;
  (__return_storage_ptr__->super_truncating_iterator_base<char_*>).out_ = pcVar2;
  (__return_storage_ptr__->super_truncating_iterator_base<char_*>).limit_ = sVar3;
  return __return_storage_ptr__;
}

Assistant:

iterator operator()(const void *value) {
    if (specs_)
      check_pointer_type_spec(specs_->type, internal::error_handler());
    write_pointer(value);
    return out();
  }